

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O0

Formula * __thiscall FOOLElimination::process(FOOLElimination *this,Formula *formula)

{
  bool bVar1;
  CNFOnTheFly CVar2;
  Connective CVar3;
  Formula *pFVar4;
  Formula *in_RSI;
  long in_RDI;
  Formula *in_stack_000000a8;
  Formula *in_stack_000000d0;
  LambdaElimination *in_stack_000000d8;
  Formula *processedFormula_4;
  Formula *processedFormula_3;
  Literal *equality;
  bool polarity;
  TermList rhsTerm;
  TermList lhsTerm;
  Formula *rhs_1;
  Formula *lhs_1;
  Formula *processedFormula_1;
  Iterator lit;
  Stack<Kernel::TermList> arguments;
  Formula *processedFormula_2;
  Connective connective;
  Formula *rhsFormula;
  Formula *lhsFormula;
  bool rhsIsFormula;
  bool lhsIsFormula;
  TermList rhs;
  TermList lhs;
  Literal *literal;
  Formula *processedFormula;
  TermList proxifiedFormula;
  LambdaElimination le;
  Options *in_stack_fffffffffffffc00;
  string *in_stack_fffffffffffffc08;
  string *in_stack_fffffffffffffc10;
  LambdaElimination *in_stack_fffffffffffffc20;
  TermList in_stack_fffffffffffffc30;
  string local_e0 [32];
  string local_c0 [32];
  uint64_t local_a0;
  Formula *local_98;
  uint64_t local_80;
  Formula *local_18;
  Formula *local_8;
  
  local_18 = in_RSI;
  CVar2 = Shell::Options::cnfOnTheFly(Lib::env);
  if ((CVar2 != EAGER) && ((*(byte *)(in_RDI + 0x19) & 1) == 0)) {
    LambdaElimination::LambdaElimination(in_stack_fffffffffffffc20);
    local_a0 = (uint64_t)LambdaElimination::elimLambda(in_stack_000000d8,in_stack_000000d0);
    local_80 = local_a0;
    local_98 = toEquality(in_stack_fffffffffffffc30);
    bVar1 = Shell::Options::showPreprocessing(in_stack_fffffffffffffc00);
    if (bVar1) {
      Kernel::Formula::toString_abi_cxx11_(in_stack_000000a8);
      Kernel::Formula::toString_abi_cxx11_(in_stack_000000a8);
      reportProcessed(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::~string(local_c0);
    }
    local_8 = local_98;
    LambdaElimination::~LambdaElimination((LambdaElimination *)in_stack_fffffffffffffc00);
    return local_8;
  }
  CVar3 = Kernel::Formula::connective(local_18);
  pFVar4 = (Formula *)(*(code *)(&DAT_00f079a0 + *(int *)(&DAT_00f079a0 + (ulong)CVar3 * 4)))();
  return pFVar4;
}

Assistant:

Formula* FOOLElimination::process(Formula* formula) {
  if(env.options->cnfOnTheFly() != Options::CNFOnTheFly::EAGER &&
     !_polymorphic){
    LambdaElimination le = LambdaElimination();
    TermList proxifiedFormula = le.elimLambda(formula);
    Formula* processedFormula = toEquality(proxifiedFormula);

    if (env.options->showPreprocessing()) {
      reportProcessed(formula->toString(), processedFormula->toString());
    }

    return processedFormula;
  }

  switch (formula->connective()) {
    case LITERAL: {
      Literal* literal = formula->literal();

      /**
       * Processing of a literal simply propagates processing to its arguments,
       * except for a case when it is an equality and one of the arguments is a
       * formula-as-term. In that case we build an equivalence between both
       * arguments, processed as formulas.
       *
       * For example, assume a and b are formulas and X is a boolean variable.
       * Then, a = b will be translated to a' <=> b', where a' and b' are
       * processed a and b, respectively. a = X will be translated as
       * a' <=> (X = true).
       *
       * The semantics of FOOL does not distinguish between equality and equivalence
       * between boolean terms and this special case implements a more natural way of
       * expressing an equality between formulas in FOL. It is not, however, strictly
       * needed - without it the equality would be processed simply as equality
       * between FOOL boolean terms.
       */

      if (literal->isEquality() &&
         (!env.getMainProblem()->isHigherOrder() || env.options->equalityToEquivalence())) {
        ASS_EQ(literal->arity(), 2);
        TermList lhs = *literal->nthArgument(0);
        TermList rhs = *literal->nthArgument(1);

        bool lhsIsFormula = lhs.isTerm() && lhs.term()->isBoolean();
        bool rhsIsFormula = rhs.isTerm() && rhs.term()->isBoolean();

        if (rhsIsFormula || lhsIsFormula) {
          Formula* lhsFormula = processAsFormula(lhs);
          Formula* rhsFormula = processAsFormula(rhs);

          Connective connective = literal->polarity() ? IFF : XOR;
          Formula* processedFormula = new BinaryFormula(connective, lhsFormula, rhsFormula);

          if (env.options->showPreprocessing()) {
            reportProcessed(formula->toString(), processedFormula->toString());
          }

          return processedFormula;
        }
      }

      Stack<TermList> arguments;
      Term::Iterator lit(literal);
      while (lit.hasNext()) {
        arguments.push(process(lit.next()));
      }

      Formula* processedFormula = new AtomicFormula(Literal::create(literal, arguments.begin()));

      if (env.options->showPreprocessing()) {
        reportProcessed(formula->toString(), processedFormula->toString());
      }

      return processedFormula;
    }

    case IFF:
    case XOR: {
      /**
       * Processing of a binary formula simply propagates processing to its
       * arguments, except for a case when it is an equivalence between two
       * boolean terms. In that case we build an equality between processed
       * underlying boolean terms.
       *
       * The semantics of FOOL does not distinguish between equality and
       * equivalence between boolean terms and this special case implements
       * a more natural way of expressing an equality between formulas in FOL.
       * It is not, however, strictly needed - without it the equality would be
       * processed simply as equality between FOOL boolean terms.
       */
      Formula* lhs = formula->left();
      Formula* rhs = formula->right();
      if (lhs->connective() == BOOL_TERM && rhs->connective() == BOOL_TERM) {
        TermList lhsTerm = lhs->getBooleanTerm();
        TermList rhsTerm = rhs->getBooleanTerm();

        bool polarity = formula->connective() == IFF;

        Literal* equality = Literal::createEquality(polarity, process(lhsTerm), process(rhsTerm), AtomicSort::boolSort());
        Formula* processedFormula = new AtomicFormula(equality);

        if (env.options->showPreprocessing()) {
          reportProcessed(formula->toString(), processedFormula->toString());
        }

        return processedFormula;
      }
      // deliberately no break here so that we would jump to the IMP case
    }

    case IMP:
      return new BinaryFormula(formula->connective(), process(formula->left()), process(formula->right()));

    case AND:
    case OR:
      return new JunctionFormula(formula->connective(), process(formula->args()));

    case NOT:
      return new NegatedFormula(process(formula->uarg()));

    case FORALL:
    case EXISTS:
      return new QuantifiedFormula(formula->connective(), formula->vars(),formula->sorts(), process(formula->qarg()));

    case BOOL_TERM: {
      Formula* processedFormula = processAsFormula(formula->getBooleanTerm());

      if (env.options->showPreprocessing()) {
        reportProcessed(formula->toString(), processedFormula->toString());
      }

      return processedFormula;
    }

    case TRUE:
    case FALSE:
      return formula;

    case NAME:
    case NOCONN:
      ASSERTION_VIOLATION;
  }
  ASSERTION_VIOLATION;
}